

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O0

ConstantValue * __thiscall
slang::ast::ReplicationExpression::evalImpl(ReplicationExpression *this,EvalContext *context)

{
  SourceRange range;
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  Type *pTVar4;
  int *piVar5;
  string *this_00;
  ConstantValue *this_01;
  ReplicationExpression *in_RSI;
  ConstantValue *in_RDI;
  int32_t i;
  string result;
  optional<int> optCount;
  ConstantValue c;
  ConstantValue v;
  string *in_stack_fffffffffffffe98;
  EvalContext *in_stack_fffffffffffffea0;
  Expression *in_stack_fffffffffffffea8;
  SVInt *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  int iVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffee8;
  undefined7 in_stack_fffffffffffffef8;
  DiagCode code;
  SVInt *in_stack_ffffffffffffff30;
  SVInt *in_stack_ffffffffffffff38;
  int local_bc;
  
  concat(in_RSI);
  Expression::eval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  count(in_RSI);
  Expression::eval(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
  bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xbd928f);
  if ((bVar1) &&
     (bVar1 = slang::ConstantValue::operator_cast_to_bool((ConstantValue *)0xbd92ac), bVar1)) {
    pTVar4 = not_null<const_slang::ast::Type_*>::operator->
                       ((not_null<const_slang::ast::Type_*> *)0xbd931f);
    code = SUB84((ulong)pTVar4 >> 0x20,0);
    uVar2 = Type::isVoid((Type *)0xbd9330);
    if ((bool)uVar2) {
      slang::ConstantValue::ConstantValue(in_RDI);
    }
    else {
      pTVar4 = not_null<const_slang::ast::Type_*>::operator->
                         ((not_null<const_slang::ast::Type_*> *)0xbd936d);
      uVar3 = Type::isString((Type *)0xbd937e);
      if ((bool)uVar3) {
        slang::ConstantValue::integer((ConstantValue *)0xbd939e);
        SVInt::as<int>((SVInt *)CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        bVar1 = std::optional::operator_cast_to_bool((optional<int> *)0xbd93d0);
        if ((bVar1) &&
           (piVar5 = std::optional<int>::operator*((optional<int> *)0xbd93e3), -1 < *piVar5)) {
          std::__cxx11::string::string(in_stack_fffffffffffffec0);
          local_bc = 0;
          while (iVar6 = local_bc, piVar5 = std::optional<int>::operator*((optional<int> *)0xbd94b5)
                , iVar6 < *piVar5) {
            this_00 = slang::ConstantValue::str_abi_cxx11_((ConstantValue *)0xbd94cd);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffffea8);
            local_bc = local_bc + 1;
          }
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffea0);
        }
        else {
          count(in_RSI);
          range.endLoc._0_7_ = in_stack_fffffffffffffef8;
          range.startLoc = (SourceLocation)pTVar4;
          range.endLoc._7_1_ = uVar2;
          EvalContext::addDiag((EvalContext *)CONCAT17(uVar3,in_stack_fffffffffffffee8),code,range);
          Diagnostic::operator<<
                    ((Diagnostic *)in_stack_fffffffffffffea0,
                     (ConstantValue *)in_stack_fffffffffffffe98);
          slang::ConstantValue::ConstantValue
                    ((ConstantValue *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        }
      }
      else {
        slang::ConstantValue::integer((ConstantValue *)0xbd9561);
        this_01 = (ConstantValue *)slang::ConstantValue::integer((ConstantValue *)0xbd9575);
        SVInt::replicate(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
        slang::ConstantValue::ConstantValue(this_01,(SVInt *)in_stack_fffffffffffffe98);
        SVInt::~SVInt(in_stack_fffffffffffffeb0);
      }
    }
  }
  else {
    slang::ConstantValue::ConstantValue
              ((ConstantValue *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  }
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xbd95f3);
  slang::ConstantValue::~ConstantValue((ConstantValue *)0xbd9600);
  return in_RDI;
}

Assistant:

ConstantValue ReplicationExpression::evalImpl(EvalContext& context) const {
    // Operands are always evaluated, even if count is zero.
    ConstantValue v = concat().eval(context);
    ConstantValue c = count().eval(context);
    if (!v || !c)
        return nullptr;

    if (type->isVoid())
        return ConstantValue::NullPlaceholder();

    if (type->isString()) {
        std::optional<int32_t> optCount = c.integer().as<int32_t>();
        if (!optCount || *optCount < 0) {
            context.addDiag(diag::ConstEvalReplicationCountInvalid, count().sourceRange) << c;
            return nullptr;
        }

        std::string result;
        for (int32_t i = 0; i < *optCount; i++)
            result.append(v.str());

        return result;
    }

    return v.integer().replicate(c.integer());
}